

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O1

_Bool do_cmd_tunnel_test(player *p,loc grid)

{
  _Bool _Var1;
  
  _Var1 = square_isknown(cave,grid);
  if (!_Var1) {
    msg("You see nothing there.");
    return false;
  }
  _Var1 = square_isperm(cave,grid);
  if (_Var1) {
    msg("This seems to be permanent rock.");
    _Var1 = square_isperm((chunk_conflict *)p->cave,grid);
    if (_Var1) {
      return false;
    }
    square_memorize(cave,grid);
  }
  else {
    _Var1 = square_isdiggable(cave,grid);
    if (_Var1) {
      return true;
    }
    _Var1 = square_iscloseddoor(cave,grid);
    if (_Var1) {
      return true;
    }
    msg("You see nothing there to tunnel.");
    _Var1 = square_isdiggable((chunk_conflict *)p->cave,grid);
    if ((!_Var1) && (_Var1 = square_iscloseddoor((chunk_conflict *)p->cave,grid), !_Var1)) {
      return false;
    }
    square_forget(cave,grid);
  }
  square_light_spot((chunk *)cave,grid);
  return false;
}

Assistant:

static bool do_cmd_tunnel_test(struct player *p, struct loc grid)
{

	/* Must have knowledge */
	if (!square_isknown(cave, grid)) {
		msg("You see nothing there.");
		return (false);
	}

	/* Titanium */
	if (square_isperm(cave, grid)) {
		msg("This seems to be permanent rock.");
		if (!square_isperm(p->cave, grid)) {
			square_memorize(cave, grid);
			square_light_spot(cave, grid);
		}
		return (false);
	}

	/* Must be a wall/door/etc */
	if (!(square_isdiggable(cave, grid) || square_iscloseddoor(cave, grid))) {
		msg("You see nothing there to tunnel.");
		if (square_isdiggable(p->cave, grid)
				|| square_iscloseddoor(p->cave, grid)) {
			square_forget(cave, grid);
			square_light_spot(cave, grid);
		}
		return (false);
	}

	/* Okay */
	return (true);
}